

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O0

bool __thiscall
dtc::fdt::checking::property_checker::check_property
          (property_checker *this,device_tree *tree,node_ptr *n,property_ptr *p)

{
  property_ptr *ppVar1;
  node_ptr *pnVar2;
  __type _Var3;
  int iVar4;
  element_type *this_00;
  string *__lhs;
  shared_ptr<dtc::fdt::property> local_40;
  property_ptr *local_30;
  property_ptr *p_local;
  node_ptr *n_local;
  device_tree *tree_local;
  property_checker *this_local;
  
  local_30 = p;
  p_local = (property_ptr *)n;
  n_local = (node_ptr *)tree;
  tree_local = (device_tree *)this;
  this_00 = std::__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)p);
  __lhs = property::get_key_abi_cxx11_(this_00);
  _Var3 = std::operator==(__lhs,&this->key);
  pnVar2 = n_local;
  ppVar1 = p_local;
  if (_Var3) {
    std::shared_ptr<dtc::fdt::property>::shared_ptr(&local_40,p);
    iVar4 = (*(this->super_checker)._vptr_checker[4])(this,pnVar2,ppVar1,&local_40);
    std::shared_ptr<dtc::fdt::property>::~shared_ptr(&local_40);
    if ((((byte)iVar4 ^ 0xff) & 1) != 0) {
      checker::report_error(&this->super_checker,"property check failed");
      return false;
    }
  }
  return true;
}

Assistant:

bool
property_checker::check_property(device_tree *tree, const node_ptr &n, property_ptr p)
{
	if (p->get_key() == key)
	{
		if (!check(tree, n, p))
		{
			report_error("property check failed");
			return false;
		}
	}
	return true;
}